

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_0::InstrumentedProxy::runOnFunction
          (InstrumentedProxy *this,Module *module,Function *func)

{
  mapped_type *pmVar1;
  Pass *pPVar2;
  Function *local_28;
  
  local_28 = func;
  pmVar1 = std::
           map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
           ::operator[](&this->analyzer->map,&local_28);
  if ((pmVar1->canChangeState == true) && ((pmVar1->isTopMostRuntime & 1U) == 0)) {
    pPVar2 = (this->pass)._M_t.super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
             super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
    if (pPVar2->runner == (PassRunner *)0x0) {
      pPVar2->runner = (this->super_Pass).runner;
      pPVar2 = (this->pass)._M_t.super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
               ._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
    }
    (*pPVar2->_vptr_Pass[3])(pPVar2,module,func);
    return;
  }
  return;
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    if (!analyzer->needsInstrumentation(func)) {
      return;
    }
    if (pass->getPassRunner() == nullptr) {
      pass->setPassRunner(getPassRunner());
    }
    pass->runOnFunction(module, func);
  }